

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.hpp
# Opt level: O2

ostream * viennamath::operator<<
                    (ostream *stream,rt_interval<viennamath::rt_expression_interface<double>_> *e)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(stream,"interval(");
  poVar1 = operator<<(poVar1,&e->lower_);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = operator<<(poVar1,&e->upper_);
  std::operator<<(poVar1,")");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, rt_interval<InterfaceType> const & e)
  {
    stream << "interval(" << e.lower() << ", " << e.upper() << ")";
    return stream;
  }